

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_add_child_head(isoent *parent,isoent *child)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  archive_rb_node *in_stack_00000010;
  archive_rb_tree *in_stack_00000018;
  undefined4 local_4;
  
  iVar2 = __archive_rb_tree_insert_node(in_stack_00000018,in_stack_00000010);
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x28);
    *(long *)(in_RSI + 0x70) = lVar1;
    if (lVar1 == 0) {
      *(long *)(in_RDI + 0x30) = in_RSI + 0x70;
    }
    *(long *)(in_RDI + 0x28) = in_RSI;
    *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
    *(long *)(in_RSI + 0x20) = in_RDI;
    if ((char)(*(char *)(in_RSI + 0xe8) << 6) < '\0') {
      lVar1 = *(long *)(in_RDI + 0x50);
      *(long *)(in_RSI + 0x78) = lVar1;
      if (lVar1 == 0) {
        *(long *)(in_RDI + 0x58) = in_RSI + 0x78;
      }
      *(long *)(in_RDI + 0x50) = in_RSI;
      *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
      *(long *)(in_RSI + 0x20) = in_RDI;
    }
    else {
      *(undefined8 *)(in_RSI + 0x78) = 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
isoent_add_child_head(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	if ((child->chnext = parent->children.first) == NULL)
		parent->children.last = &(child->chnext);
	parent->children.first = child;
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	if (child->dir) {
		if ((child->drnext = parent->subdirs.first) == NULL)
			parent->subdirs.last = &(child->drnext);
		parent->subdirs.first = child;
		parent->subdirs.cnt++;
		child->parent = parent;
	} else
		child->drnext = NULL;
	return (1);
}